

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O3

_Bool fs_stdio_entry_exists(ALLEGRO_FS_ENTRY *fp)

{
  int iVar1;
  int *piVar2;
  WRAP_STAT_TYPE st;
  stat sStack_98;
  
  iVar1 = stat((char *)fp[1].vtable,&sStack_98);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 2) {
      al_set_errno(*piVar2);
    }
  }
  return iVar1 == 0;
}

Assistant:

static bool fs_stdio_entry_exists(ALLEGRO_FS_ENTRY *fp)
{
   ALLEGRO_FS_ENTRY_STDIO *fp_stdio = (ALLEGRO_FS_ENTRY_STDIO *) fp;
   WRAP_STAT_TYPE st;

   if (WRAP_STAT(fp_stdio->abs_path, &st) != 0) {
      if (errno != ENOENT) {
         al_set_errno(errno);
      }
      return false;
   }

   return true;
}